

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O3

void GEN_CS::gen_cs_test_example(multi_ex *examples,label *cs_labels)

{
  ulong uVar1;
  wclass local_30;
  
  v_array<COST_SENSITIVE::wclass>::clear(&cs_labels->costs);
  if ((examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar1 = 0;
    do {
      local_30.x = 3.4028235e+38;
      local_30.partial_prediction = 0.0;
      local_30.wap_value = 0.0;
      local_30.class_index = (uint32_t)uVar1;
      v_array<COST_SENSITIVE::wclass>::push_back(&cs_labels->costs,&local_30);
      uVar1 = (ulong)((uint32_t)uVar1 + 1);
    } while (uVar1 < (ulong)((long)(examples->
                                   super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(examples->
                                   super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void gen_cs_test_example(multi_ex& examples, COST_SENSITIVE::label& cs_labels)
{
  cs_labels.costs.clear();
  for (uint32_t i = 0; i < examples.size(); i++)
  {
    COST_SENSITIVE::wclass wc = {FLT_MAX, i, 0., 0.};
    cs_labels.costs.push_back(wc);
  }
}